

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

string * __thiscall
t_js_generator::declare_field_abi_cxx11_
          (string *__return_storage_ptr__,t_js_generator *this,t_field *tfield,bool init,bool obj)

{
  uint uVar1;
  int iVar2;
  string *psVar3;
  t_type *type_00;
  t_program *p;
  undefined4 extraout_var;
  undefined1 auVar4 [12];
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_a9;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  t_base local_64;
  t_base_type *ptStack_60;
  t_base tbase;
  t_type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_23;
  byte local_22;
  byte local_21;
  bool obj_local;
  t_field *ptStack_20;
  bool init_local;
  t_field *tfield_local;
  t_js_generator *this_local;
  string *result;
  
  local_23 = 0;
  local_22 = obj;
  local_21 = init;
  ptStack_20 = tfield;
  tfield_local = (t_field *)this;
  this_local = (t_js_generator *)__return_storage_ptr__;
  psVar3 = t_field::get_name_abi_cxx11_(tfield);
  std::operator+(__return_storage_ptr__,"this.",psVar3);
  if ((local_22 & 1) == 0) {
    psVar3 = t_field::get_name_abi_cxx11_(ptStack_20);
    std::operator+(&local_48,&this->js_let_type_,psVar3);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((local_21 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," = null");
  }
  else {
    type_00 = t_field::get_type(ptStack_20);
    ptStack_60 = (t_base_type *)t_generator::get_true_type(type_00);
    uVar1 = (*(ptStack_60->super_t_type).super_t_doc._vptr_t_doc[5])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ptStack_60->super_t_type).super_t_doc._vptr_t_doc[10])();
      if ((uVar1 & 1) == 0) {
        uVar1 = (*(ptStack_60->super_t_type).super_t_doc._vptr_t_doc[0x10])();
        if ((uVar1 & 1) == 0) {
          uVar1 = (*(ptStack_60->super_t_type).super_t_doc._vptr_t_doc[0xd])();
          if ((uVar1 & 1) == 0) {
            uVar1 = (*(ptStack_60->super_t_type).super_t_doc._vptr_t_doc[0xb])();
            if (((uVar1 & 1) != 0) ||
               (uVar1 = (*(ptStack_60->super_t_type).super_t_doc._vptr_t_doc[0xc])(),
               (uVar1 & 1) != 0)) {
              if ((local_22 & 1) == 0) {
                std::__cxx11::string::operator+=((string *)__return_storage_ptr__," = null");
              }
              else {
                p = t_type::get_program(&ptStack_60->super_t_type);
                js_type_namespace_abi_cxx11_(&local_130,this,p);
                std::operator+(&local_110," = new ",&local_130);
                iVar2 = (*(ptStack_60->super_t_type).super_t_doc._vptr_t_doc[3])();
                std::operator+(&local_f0,&local_110,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(extraout_var,iVar2));
                std::operator+(&local_d0,&local_f0,"()");
                std::__cxx11::string::operator+=
                          ((string *)__return_storage_ptr__,(string *)&local_d0);
                std::__cxx11::string::~string((string *)&local_d0);
                std::__cxx11::string::~string((string *)&local_f0);
                std::__cxx11::string::~string((string *)&local_110);
                std::__cxx11::string::~string((string *)&local_130);
              }
            }
          }
          else {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__," = null");
          }
        }
        else {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__," = null");
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," = null");
      }
    }
    else {
      local_64 = t_base_type::get_base(ptStack_60);
      if (local_64 != TYPE_VOID) {
        if (6 < local_64 - TYPE_STRING) {
          local_a9 = 1;
          auVar4 = __cxa_allocate_exception(0x10);
          t_base_type::t_base_name_abi_cxx11_(&local_a8,(t_base_type *)(ulong)local_64,auVar4._8_4_)
          ;
          std::operator+(&local_88,"compiler error: no JS initializer for base type ",&local_a8);
          std::runtime_error::runtime_error(auVar4._0_8_,(string *)&local_88);
          local_a9 = 0;
          __cxa_throw(auVar4._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
          ;
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," = null");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_js_generator::declare_field(t_field* tfield, bool init, bool obj) {
  string result = "this." + tfield->get_name();

  if (!obj) {
    result = js_let_type_ + tfield->get_name();
  }

  if (init) {
    t_type* type = get_true_type(tfield->get_type());
    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        break;
      case t_base_type::TYPE_STRING:
      case t_base_type::TYPE_BOOL:
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
      case t_base_type::TYPE_DOUBLE:
        result += " = null";
        break;
      default:
        throw std::runtime_error("compiler error: no JS initializer for base type " + t_base_type::t_base_name(tbase));
      }
    } else if (type->is_enum()) {
      result += " = null";
    } else if (type->is_map()) {
      result += " = null";
    } else if (type->is_container()) {
      result += " = null";
    } else if (type->is_struct() || type->is_xception()) {
      if (obj) {
        result += " = new " + js_type_namespace(type->get_program()) + type->get_name() + "()";
      } else {
        result += " = null";
      }
    }
  } else {
    result += " = null";
  }
  return result;
}